

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O2

bool ctemplate::anon_unknown_14::PragmaMarker::IsValidAttribute
               (PragmaId pragma_id,char *name,size_t namelen)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  long lVar3;
  
  lVar3 = 0;
  while( true ) {
    if ((lVar3 == 2) ||
       (__s = *(char **)(&DAT_001532c0 + lVar3 * 8 + (ulong)pragma_id * 0x20), __s == (char *)0x0))
    {
      return false;
    }
    sVar2 = strlen(__s);
    if ((sVar2 == namelen) && (iVar1 = strncasecmp(__s,name,namelen), iVar1 == 0)) break;
    lVar3 = lVar3 + 1;
  }
  return true;
}

Assistant:

bool PragmaMarker::IsValidAttribute(PragmaId pragma_id, const char* name,
                                    size_t namelen) {
  const int kMaxAttributes = sizeof(g_pragmas[0].attribute_names) /
      sizeof(*g_pragmas[0].attribute_names);
  for (int i = 0; i < kMaxAttributes; ++i) {
    const char* attr_name = g_pragmas[pragma_id].attribute_names[i];
    if (attr_name == NULL)
      break;
    if ((strlen(attr_name) == namelen) &&
        (strncasecmp(attr_name, name, namelen) == 0))
      // We found the given name in our accepted attribute list.
      return true;
  }
  return false;  // We did not find the name.
}